

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

Json __thiscall YdiskRestClient::get_disk_info(YdiskRestClient *this)

{
  undefined8 extraout_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  YdiskRestClient *pYVar1;
  Json JVar2;
  shared_ptr<httplib::Response> r;
  string error;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  _Base_ptr p_Stack_30;
  _Base_ptr local_28;
  size_t sStack_20;
  
  local_28 = (_Base_ptr)0x0;
  sStack_20 = 0;
  local_58._32_8_ = 0;
  p_Stack_30 = (_Base_ptr)0x0;
  httplib::Client::Get
            ((Client *)local_88,*(char **)(in_RSI + 8),(Headers *)"/v1/disk/",
             (Progress *)(in_RSI + 0x10));
  pYVar1 = (YdiskRestClient *)(local_58 + 0x20);
  std::_Function_base::~_Function_base((_Function_base *)pYVar1);
  if (((Response *)local_88._0_8_ != (Response *)0x0) && (*(int *)(local_88._0_8_ + 0x20) == 200)) {
    local_78._0_8_ = &local_68;
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    json11::Json::parse((Json *)this,(string *)(local_88._0_8_ + 0x58),(string *)local_78,STANDARD);
    std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_98,(__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)this);
    pYVar1 = (YdiskRestClient *)local_58;
    std::__cxx11::string::string((string *)pYVar1,(string *)local_78);
    check_parsing_result(pYVar1,(Json *)&_Stack_98,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
    std::__cxx11::string::~string((string *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Json)JVar2.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  throw_response_error(pYVar1,(Response *)local_88._0_8_);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->http_client);
  std::__cxx11::string::~string((string *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Json YdiskRestClient::get_disk_info()
{
    auto r = http_client->Get("/v1/disk/", headers);

    if(r.get() && r->status==200){
        std::string error;
        auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        return json;
    } else {
        throw_response_error(r.get());
    }
}